

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error ft_open_face_internal
                   (FT_Library library,FT_Open_Args *args,FT_Long face_index,FT_Face_conflict *aface
                   ,FT_Bool test_mac_fonts)

{
  undefined8 *puVar1;
  uint uVar2;
  FT_Memory pFVar3;
  FT_ListNode pFVar4;
  ulong uVar5;
  FT_Bitmap_Size *pFVar6;
  long lVar7;
  FT_Face_Internal pFVar8;
  bool bVar9;
  bool bVar10;
  FT_Face_conflict face_00;
  FT_Library library_00;
  uint uVar11;
  int iVar12;
  FT_Error FVar13;
  undefined4 extraout_var;
  unsigned_long uVar15;
  FT_ListNode pFVar16;
  short sVar17;
  byte bVar18;
  FT_Stream pFVar19;
  FT_ListRec *pFVar20;
  FT_Int num_params;
  undefined7 in_register_00000081;
  FT_Parameter *params;
  FT_Parameter *pFVar21;
  FT_Driver driver;
  FT_Memory pFVar22;
  FT_Module *ppFVar23;
  long lVar24;
  FT_Long local_1e8;
  FT_Long offsets [9];
  undefined1 local_198 [8];
  FT_Open_Args args2;
  FT_Error errors [9];
  undefined8 local_128;
  char *file_names [9];
  char local_d6;
  byte local_d5;
  byte local_d4;
  byte local_d3;
  byte local_d2;
  FT_Stream local_88;
  FT_Face_conflict local_80;
  FT_Face face;
  undefined8 local_70;
  FT_Library local_68;
  FT_Memory local_60;
  FT_Stream local_58;
  FT_Stream stream;
  FT_Face_conflict *local_48;
  FT_Stream local_40;
  uint local_34;
  FT_Driver pFVar14;
  
  local_58 = (FT_Stream)0x0;
  local_80 = (FT_Face)0x0;
  if (args == (FT_Open_Args *)0x0) {
    return 6;
  }
  if (-1 < face_index && aface == (FT_Face_conflict *)0x0) {
    return 6;
  }
  if ((args->flags & 2) == 0) {
    local_34 = 0;
  }
  else {
    local_34 = (uint)(args->stream != (FT_Stream)0x0);
  }
  stream = (FT_Stream)face_index;
  uVar11 = FT_Stream_New(library,args,&local_58);
  pFVar14 = (FT_Driver)CONCAT44(extraout_var,uVar11);
  face = (FT_Face)args;
  local_68 = library;
  if (uVar11 == 0) {
    pFVar22 = library->memory;
    if (((args->flags & 8) == 0) || (driver = (FT_Driver)args->driver, driver == (FT_Driver)0x0)) {
      uVar2 = library->num_modules;
      if ((ulong)uVar2 != 0) {
        local_40 = (FT_Stream)
                   CONCAT44(local_40._4_4_,(int)CONCAT71(in_register_00000081,test_mac_fonts));
        ppFVar23 = library->modules;
        uVar11 = 0xb;
        pFVar14 = (FT_Driver)0x0;
        local_70 = CONCAT44(local_70._4_4_,local_34) & 0xffffffff000000ff;
        local_60 = pFVar22;
        local_48 = aface;
        do {
          pFVar19 = local_40;
          driver = (FT_Driver)*ppFVar23;
          if ((((driver->root).clazz)->module_flags & 1) != 0) {
            if ((face->num_faces & 0x10) == 0) {
              params = (FT_Parameter *)0x0;
              pFVar21 = (FT_Parameter *)0x0;
            }
            else {
              params = (FT_Parameter *)(ulong)*(uint *)&face->style_name;
              pFVar21 = *(FT_Parameter **)&face->num_fixed_sizes;
            }
            uVar11 = open_face(driver,&local_58,(FT_Bool)local_70,(FT_Long)stream,(FT_Int)params,
                               pFVar21,&local_80);
            aface = local_48;
            pFVar22 = local_60;
            if (uVar11 == 0) goto LAB_001eba4a;
            if ((((char)pFVar19 != '\0') &&
                (iVar12 = strcmp((*ppFVar23)->clazz->module_name,"truetype"), pFVar19 = local_58,
                (char)uVar11 == -0x72)) && (iVar12 == 0)) {
              if ((local_58->read != (FT_Stream_IoFunc)0x0) &&
                 (uVar15 = (*local_58->read)(local_58,0,(uchar *)0x0,0), aface = local_48,
                 pFVar22 = local_60, uVar15 != 0)) goto LAB_001eb54d;
              pFVar19->pos = 0;
              uVar11 = open_face_PS_from_sfnt_stream
                                 (local_68,pFVar19,(FT_Long)stream,(FT_Int)local_48,params,
                                  (FT_Face_conflict *)pFVar21);
              if (uVar11 == 0) {
                pFVar22 = pFVar19->memory;
                if (pFVar19->close != (FT_Stream_CloseFunc)0x0) {
                  (*pFVar19->close)(pFVar19);
                }
                goto joined_r0x001ebb45;
              }
            }
            pFVar14 = driver;
            if ((char)uVar11 != '\x02') break;
          }
          ppFVar23 = ppFVar23 + 1;
        } while (ppFVar23 < library->modules + uVar2);
        test_mac_fonts = (FT_Bool)local_40;
        driver = pFVar14;
        aface = local_48;
        pFVar22 = local_60;
        goto LAB_001eb521;
      }
      driver = (FT_Driver)0x0;
      uVar11 = 0xb;
    }
    else {
      uVar11 = 0x20;
      if ((((driver->root).clazz)->module_flags & 1) != 0) {
        if ((args->flags & 0x10) == 0) {
          num_params = 0;
          pFVar21 = (FT_Parameter *)0x0;
        }
        else {
          num_params = args->num_params;
          pFVar21 = args->params;
        }
        uVar11 = open_face(driver,&local_58,(FT_Bool)local_34,(FT_Long)stream,num_params,pFVar21,
                           &local_80);
        if (uVar11 == 0) {
LAB_001eba4a:
          pFVar16 = (FT_ListNode)(*pFVar22->alloc)(pFVar22,0x18);
          face_00 = local_80;
          if (pFVar16 != (FT_ListNode)0x0) {
            pFVar16->prev = (FT_ListNode)0x0;
            pFVar16->next = (FT_ListNode)0x0;
            pFVar16->data = local_80;
            pFVar14 = local_80->driver;
            pFVar4 = (pFVar14->faces_list).tail;
            pFVar20 = (FT_ListRec *)&pFVar4->next;
            if (pFVar4 == (FT_ListNode)0x0) {
              pFVar20 = &pFVar14->faces_list;
            }
            pFVar16->prev = pFVar4;
            pFVar20->head = pFVar16;
            (pFVar14->faces_list).tail = pFVar16;
            if (-1 < (long)stream) {
              FVar13 = FT_New_GlyphSlot(local_80,(FT_GlyphSlot *)0x0);
              if ((FVar13 != 0) ||
                 (FVar13 = FT_New_Size(face_00,(FT_Size *)&local_128), FVar13 != 0)) {
                FT_Done_Face(face_00);
                return FVar13;
              }
              face_00->size =
                   (FT_Size)CONCAT62(local_128._2_6_,CONCAT11(local_128._1_1_,(FT_Byte)local_128));
            }
            uVar5 = face_00->face_flags;
            if ((uVar5 & 1) != 0) {
              sVar17 = face_00->height;
              if (sVar17 < 0) {
                sVar17 = -sVar17;
                face_00->height = sVar17;
              }
              if ((uVar5 & 0x20) == 0) {
                face_00->max_advance_height = sVar17;
              }
            }
            if (((uVar5 & 2) != 0) && (iVar12 = face_00->num_fixed_sizes, 0 < (long)iVar12)) {
              pFVar6 = face_00->available_sizes;
              lVar24 = 0;
              do {
                sVar17 = *(short *)((long)&pFVar6->height + lVar24);
                if (sVar17 < 0) {
                  sVar17 = -sVar17;
                  *(short *)((long)&pFVar6->height + lVar24) = sVar17;
                  bVar18 = (byte)((ushort)sVar17 >> 0xf);
                }
                else {
                  bVar18 = 0;
                }
                lVar7 = *(long *)((long)&pFVar6->x_ppem + lVar24);
                if (lVar7 < 0) {
                  *(long *)((long)&pFVar6->x_ppem + lVar24) = -lVar7;
                }
                lVar7 = *(long *)((long)&pFVar6->y_ppem + lVar24);
                if (lVar7 < 0) {
                  *(long *)((long)&pFVar6->y_ppem + lVar24) = -lVar7;
                }
                if (bVar18 != 0) {
                  *(undefined4 *)((long)&pFVar6->height + lVar24) = 0;
                  puVar1 = (undefined8 *)((long)&pFVar6->size + lVar24);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                  *(undefined8 *)((long)&pFVar6->y_ppem + lVar24) = 0;
                }
                lVar24 = lVar24 + 0x20;
              } while ((long)iVar12 * 0x20 != lVar24);
            }
            pFVar8 = face_00->internal;
            (pFVar8->transform_matrix).xx = 0x10000;
            (pFVar8->transform_matrix).xy = 0;
            (pFVar8->transform_matrix).yx = 0;
            (pFVar8->transform_matrix).yy = 0x10000;
            (pFVar8->transform_delta).x = 0;
            (pFVar8->transform_delta).y = 0;
            pFVar8->refcount = 1;
            pFVar8->no_stem_darkening = -1;
            if (aface == (FT_Face_conflict *)0x0) {
              FT_Done_Face(face_00);
            }
            else {
              *aface = face_00;
            }
            return 0;
          }
          uVar11 = 0x40;
          goto LAB_001eb9ae;
        }
      }
    }
  }
  else {
    driver = (FT_Driver)0x0;
    pFVar22 = (FT_Memory)0x0;
LAB_001eb521:
    if ((char)uVar11 != '\x02') {
      pFVar14 = (FT_Driver)0x0;
      if (((uVar11 & 0xff) != 0x55) && ((uVar11 & 0xff) != 0x51)) goto LAB_001eb982;
    }
    if (test_mac_fonts != '\0') {
      pFVar19 = local_58;
      if (local_58 == (FT_Stream)0x0) {
        local_70 = CONCAT71((int7)((ulong)pFVar14 >> 8),1);
        pFVar19 = (FT_Stream)0x0;
LAB_001eb719:
        uVar11 = 0x55;
LAB_001eb71e:
        if ((face->num_faces & 4) != 0) {
          pFVar3 = local_68->memory;
          local_88 = (FT_Stream)0x0;
          local_60 = pFVar22;
          local_48 = aface;
          local_40 = pFVar19;
          FT_Raccess_Guess(local_68,pFVar19,(char *)face->style_flags,(char **)&local_128,&local_1e8
                           ,(FT_Error *)&args2.params);
          iVar12 = 2;
          lVar24 = 0;
          bVar9 = false;
          do {
            library_00 = local_68;
            uVar11 = (&ft_raccess_guess_table[0].type)[lVar24] + ~FT_RFork_Rule_darwin_ufs_export;
            bVar10 = bVar9;
            if (((1 < uVar11) || (!bVar9)) && (*(int *)((long)errors + lVar24 + -8) == 0)) {
              local_198._0_4_ = 4;
              args2.memory_size = *(long *)((long)file_names + lVar24 * 2 + -8);
              if (args2.memory_size == 0) {
                args2.memory_size = face->style_flags;
              }
              iVar12 = FT_Stream_New(local_68,(FT_Open_Args *)local_198,&local_88);
              pFVar19 = local_88;
              if ((char)iVar12 == 'Q') {
                bVar10 = true;
              }
              if (1 < uVar11) {
                bVar10 = bVar9;
              }
              if (iVar12 == 0) {
                iVar12 = IsMacResource(library_00,local_88,
                                       *(FT_Long *)((long)offsets + lVar24 * 2 + -8),(FT_Long)stream
                                       ,local_48);
                if (pFVar19 != (FT_Stream)0x0) {
                  pFVar22 = pFVar19->memory;
                  if (pFVar19->close != (FT_Stream_CloseFunc)0x0) {
                    (*pFVar19->close)(pFVar19);
                  }
                  (*pFVar22->free)(pFVar22,pFVar19);
                }
                if (iVar12 == 0) {
                  iVar12 = 0;
                  break;
                }
                bVar10 = bVar9;
                if (uVar11 < 2) {
                  bVar10 = true;
                }
              }
            }
            bVar9 = bVar10;
            lVar24 = lVar24 + 4;
          } while (lVar24 != 0x24);
          pFVar22 = local_60;
          lVar24 = 0;
          do {
            if (file_names[lVar24 + -1] != (char *)0x0) {
              (*pFVar3->free)(pFVar3,file_names[lVar24 + -1]);
              file_names[lVar24 + -1] = (char *)0x0;
            }
            lVar24 = lVar24 + 1;
          } while (lVar24 != 9);
          uVar11 = 2;
          pFVar19 = local_40;
          if (iVar12 == 0) goto LAB_001eb9d6;
          goto LAB_001eb982;
        }
      }
      else {
LAB_001eb54d:
        if (pFVar19->read != (FT_Stream_IoFunc)0x0) {
          local_70 = 0;
          uVar15 = (*pFVar19->read)(pFVar19,0,(uchar *)0x0,0);
          if (uVar15 != 0) goto LAB_001eb719;
        }
        pFVar19->pos = 0;
        local_40 = pFVar19;
        uVar11 = FT_Stream_Read(pFVar19,(FT_Byte *)&local_128,0x80);
        if (uVar11 == 0) {
          if (((((FT_Byte)local_128 == '\0') && (file_names[8]._2_1_ == '\0')) && (local_d6 == '\0')
              ) && (((0xde < (byte)(local_128._1_1_ - 0x22) && (file_names[6]._7_1_ == '\0')) &&
                    (-1 < (char)local_d5 &&
                     *(FT_Byte *)((long)&local_128 + (ulong)local_128._1_1_ + 2) == '\0')))) {
            uVar11 = IsMacResource(local_68,local_40,
                                   ((ulong)((uint)local_d3 << 8 |
                                           (uint)local_d4 << 0x10 | (uint)local_d5 << 0x18) +
                                    (ulong)local_d2 + 0x7f & 0xffffffffffffff80) + 0x80,
                                   (FT_Long)stream,aface);
            goto LAB_001eb5a5;
          }
LAB_001eb93a:
          uVar11 = IsMacResource(local_68,local_40,0,(FT_Long)stream,aface);
        }
        else {
LAB_001eb5a5:
          if ((char)uVar11 == '\x02') goto LAB_001eb93a;
        }
        local_70 = 0;
        pFVar19 = local_40;
        if (((char)uVar11 == 'U') || ((uVar11 & 0xff) == 2)) goto LAB_001eb71e;
      }
      if (uVar11 == 0) {
LAB_001eb9d6:
        if ((char)local_70 != '\0') {
          return 0;
        }
        pFVar22 = pFVar19->memory;
        if (pFVar19->close != (FT_Stream_CloseFunc)0x0) {
          (*pFVar19->close)(pFVar19);
        }
joined_r0x001ebb45:
        if ((FT_Bool)local_34 != '\0') {
          return 0;
        }
        (*pFVar22->free)(pFVar22,pFVar19);
        return 0;
      }
    }
    if ((char)uVar11 == '\x02') {
      uVar11 = 2;
    }
  }
LAB_001eb982:
  pFVar19 = local_58;
  if (local_58 != (FT_Stream)0x0) {
    pFVar3 = local_58->memory;
    if (local_58->close != (FT_Stream_CloseFunc)0x0) {
      (*local_58->close)(local_58);
    }
    if ((FT_Bool)local_34 == '\0') {
      (*pFVar3->free)(pFVar3,pFVar19);
    }
  }
LAB_001eb9ae:
  if (local_80 != (FT_Face)0x0) {
    destroy_face(pFVar22,local_80,driver);
  }
  return uVar11;
}

Assistant:

static FT_Error
  ft_open_face_internal( FT_Library           library,
                         const FT_Open_Args*  args,
                         FT_Long              face_index,
                         FT_Face             *aface,
                         FT_Bool              test_mac_fonts )
  {
    FT_Error     error;
    FT_Driver    driver = NULL;
    FT_Memory    memory = NULL;
    FT_Stream    stream = NULL;
    FT_Face      face   = NULL;
    FT_ListNode  node   = NULL;
    FT_Bool      external_stream;
    FT_Module*   cur;
    FT_Module*   limit;

#ifndef FT_CONFIG_OPTION_MAC_FONTS
    FT_UNUSED( test_mac_fonts );
#endif


#ifdef FT_DEBUG_LEVEL_TRACE
    FT_TRACE3(( "FT_Open_Face: " ));
    if ( face_index < 0 )
      FT_TRACE3(( "Requesting number of faces and named instances\n"));
    else
    {
      FT_TRACE3(( "Requesting face %ld", face_index & 0xFFFFL ));
      if ( face_index & 0x7FFF0000L )
        FT_TRACE3(( ", named instance %ld", face_index >> 16 ));
      FT_TRACE3(( "\n" ));
    }
#endif

    /* test for valid `library' delayed to `FT_Stream_New' */

    if ( ( !aface && face_index >= 0 ) || !args )
      return FT_THROW( Invalid_Argument );

    external_stream = FT_BOOL( ( args->flags & FT_OPEN_STREAM ) &&
                               args->stream                     );

    /* create input stream */
    error = FT_Stream_New( library, args, &stream );
    if ( error )
      goto Fail3;

    memory = library->memory;

    /* If the font driver is specified in the `args' structure, use */
    /* it.  Otherwise, we scan the list of registered drivers.      */
    if ( ( args->flags & FT_OPEN_DRIVER ) && args->driver )
    {
      driver = FT_DRIVER( args->driver );

      /* not all modules are drivers, so check... */
      if ( FT_MODULE_IS_DRIVER( driver ) )
      {
        FT_Int         num_params = 0;
        FT_Parameter*  params     = NULL;


        if ( args->flags & FT_OPEN_PARAMS )
        {
          num_params = args->num_params;
          params     = args->params;
        }

        error = open_face( driver, &stream, external_stream, face_index,
                           num_params, params, &face );
        if ( !error )
          goto Success;
      }
      else
        error = FT_THROW( Invalid_Handle );

      FT_Stream_Free( stream, external_stream );
      goto Fail;
    }
    else
    {
      error = FT_ERR( Missing_Module );

      /* check each font driver for an appropriate format */
      cur   = library->modules;
      limit = cur + library->num_modules;

      for ( ; cur < limit; cur++ )
      {
        /* not all modules are font drivers, so check... */
        if ( FT_MODULE_IS_DRIVER( cur[0] ) )
        {
          FT_Int         num_params = 0;
          FT_Parameter*  params     = NULL;


          driver = FT_DRIVER( cur[0] );

          if ( args->flags & FT_OPEN_PARAMS )
          {
            num_params = args->num_params;
            params     = args->params;
          }

          error = open_face( driver, &stream, external_stream, face_index,
                             num_params, params, &face );
          if ( !error )
            goto Success;

#ifdef FT_CONFIG_OPTION_MAC_FONTS
          if ( test_mac_fonts                                           &&
               ft_strcmp( cur[0]->clazz->module_name, "truetype" ) == 0 &&
               FT_ERR_EQ( error, Table_Missing )                        )
          {
            /* TrueType but essential tables are missing */
            error = FT_Stream_Seek( stream, 0 );
            if ( error )
              break;

            error = open_face_PS_from_sfnt_stream( library,
                                                   stream,
                                                   face_index,
                                                   num_params,
                                                   params,
                                                   aface );
            if ( !error )
            {
              FT_Stream_Free( stream, external_stream );
              return error;
            }
          }
#endif

          if ( FT_ERR_NEQ( error, Unknown_File_Format ) )
            goto Fail3;
        }
      }

    Fail3:
      /* If we are on the mac, and we get an                          */
      /* FT_Err_Invalid_Stream_Operation it may be because we have an */
      /* empty data fork, so we need to check the resource fork.      */
      if ( FT_ERR_NEQ( error, Cannot_Open_Stream )       &&
           FT_ERR_NEQ( error, Unknown_File_Format )      &&
           FT_ERR_NEQ( error, Invalid_Stream_Operation ) )
        goto Fail2;

#if !defined( FT_MACINTOSH ) && defined( FT_CONFIG_OPTION_MAC_FONTS )
      if ( test_mac_fonts )
      {
        error = load_mac_face( library, stream, face_index, aface, args );
        if ( !error )
        {
          /* We don't want to go to Success here.  We've already done   */
          /* that.  On the other hand, if we succeeded we still need to */
          /* close this stream (we opened a different stream which      */
          /* extracted the interesting information out of this stream   */
          /* here.  That stream will still be open and the face will    */
          /* point to it).                                              */
          FT_Stream_Free( stream, external_stream );
          return error;
        }
      }

      if ( FT_ERR_NEQ( error, Unknown_File_Format ) )
        goto Fail2;
#endif  /* !FT_MACINTOSH && FT_CONFIG_OPTION_MAC_FONTS */

      /* no driver is able to handle this format */
      error = FT_THROW( Unknown_File_Format );

  Fail2:
      FT_Stream_Free( stream, external_stream );
      goto Fail;
    }

  Success:
    FT_TRACE4(( "FT_Open_Face: New face object, adding to list\n" ));

    /* add the face object to its driver's list */
    if ( FT_NEW( node ) )
      goto Fail;

    node->data = face;
    /* don't assume driver is the same as face->driver, so use */
    /* face->driver instead.                                   */
    FT_List_Add( &face->driver->faces_list, node );

    /* now allocate a glyph slot object for the face */
    FT_TRACE4(( "FT_Open_Face: Creating glyph slot\n" ));

    if ( face_index >= 0 )
    {
      error = FT_New_GlyphSlot( face, NULL );
      if ( error )
        goto Fail;

      /* finally, allocate a size object for the face */
      {
        FT_Size  size;


        FT_TRACE4(( "FT_Open_Face: Creating size object\n" ));

        error = FT_New_Size( face, &size );
        if ( error )
          goto Fail;

        face->size = size;
      }
    }

    /* some checks */

    if ( FT_IS_SCALABLE( face ) )
    {
      if ( face->height < 0 )
        face->height = (FT_Short)-face->height;

      if ( !FT_HAS_VERTICAL( face ) )
        face->max_advance_height = (FT_Short)face->height;
    }

    if ( FT_HAS_FIXED_SIZES( face ) )
    {
      FT_Int  i;


      for ( i = 0; i < face->num_fixed_sizes; i++ )
      {
        FT_Bitmap_Size*  bsize = face->available_sizes + i;


        if ( bsize->height < 0 )
          bsize->height = -bsize->height;
        if ( bsize->x_ppem < 0 )
          bsize->x_ppem = -bsize->x_ppem;
        if ( bsize->y_ppem < 0 )
          bsize->y_ppem = -bsize->y_ppem;

        /* check whether negation actually has worked */
        if ( bsize->height < 0 || bsize->x_ppem < 0 || bsize->y_ppem < 0 )
        {
          FT_TRACE0(( "FT_Open_Face:"
                      " Invalid bitmap dimensions for strike %d,"
                      " now disabled\n", i ));
          bsize->width  = 0;
          bsize->height = 0;
          bsize->size   = 0;
          bsize->x_ppem = 0;
          bsize->y_ppem = 0;
        }
      }
    }

    /* initialize internal face data */
    {
      FT_Face_Internal  internal = face->internal;


      internal->transform_matrix.xx = 0x10000L;
      internal->transform_matrix.xy = 0;
      internal->transform_matrix.yx = 0;
      internal->transform_matrix.yy = 0x10000L;

      internal->transform_delta.x = 0;
      internal->transform_delta.y = 0;

      internal->refcount = 1;

      internal->no_stem_darkening = -1;

#ifdef FT_CONFIG_OPTION_SUBPIXEL_RENDERING
      /* Per-face filtering can only be set up by FT_Face_Properties */
      internal->lcd_filter_func = NULL;
#endif
    }

    if ( aface )
      *aface = face;
    else
      FT_Done_Face( face );

    goto Exit;

  Fail:
    if ( node )
      FT_Done_Face( face );    /* face must be in the driver's list */
    else if ( face )
      destroy_face( memory, face, driver );

  Exit:
#ifdef FT_DEBUG_LEVEL_TRACE
    if ( !error && face_index < 0 )
    {
      FT_TRACE3(( "FT_Open_Face: The font has %ld face%s\n"
                  "              and %ld named instance%s for face %ld\n",
                  face->num_faces,
                  face->num_faces == 1 ? "" : "s",
                  face->style_flags >> 16,
                  ( face->style_flags >> 16 ) == 1 ? "" : "s",
                  -face_index - 1 ));
    }
#endif

    FT_TRACE4(( "FT_Open_Face: Return 0x%x\n", error ));

    return error;
  }